

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  int i;
  int iVar3;
  char *pcVar4;
  int x;
  int m;
  int n;
  Tree t2;
  Tree t1;
  int local_4c;
  int local_48;
  int local_44;
  Tree local_40;
  Tree local_30;
  
  local_30.mRoot = (Node *)0x0;
  local_30.mSize = 0;
  local_40.mRoot = (Node *)0x0;
  local_40.mSize = 0;
  std::istream::operator>>((istream *)&std::cin,&local_44);
  for (iVar3 = 0; iVar3 < local_44; iVar3 = iVar3 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_4c);
    Tree::insert(&local_30,local_4c);
  }
  std::istream::operator>>((istream *)&std::cin,&local_48);
  for (iVar3 = 0; iVar3 < local_48; iVar3 = iVar3 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_4c);
    Tree::insert(&local_40,local_4c);
  }
  bVar1 = Tree::isSameBinaryTree(&local_30,&local_40);
  pcVar4 = "False";
  if (bVar1) {
    pcVar4 = "True";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  Tree::~Tree(&local_40);
  Tree::~Tree(&local_30);
  return 0;
}

Assistant:

int main()
{
    Tree t1;
    Tree t2;
    int n, m, x;
    cin>>n;
    for (int i = 0; i < n; i++) {
        cin>>x;
        t1.insert(x);
    }
    cin>>m;
    for (int i = 0; i < m; i++) {
        cin>>x;
        t2.insert(x);
    }
    if (t1.isSameBinaryTree(t2)) {
        cout<<"True"<<endl;
    } else {
        cout<<"False"<<endl;
    }
    return 0;
}